

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

breakpoint_id __thiscall
cmDebugger_impl::SetBreakpoint(cmDebugger_impl *this,string *fileName,size_t line)

{
  breakpoint_id bVar1;
  breakpoint_id local_30;
  size_t nextId;
  lock_guard<std::mutex> l;
  size_t line_local;
  string *fileName_local;
  cmDebugger_impl *this_local;
  
  l._M_device = (mutex_type *)line;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&nextId,&this->breakpointMutex);
  local_30 = this->nextBreakId;
  this->nextBreakId = local_30 + 1;
  std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>::
  emplace_back<unsigned_long&,std::__cxx11::string_const&,unsigned_long&>
            ((vector<cmBreakpoint,std::allocator<cmBreakpoint>> *)&this->breakpoints,&local_30,
             fileName,(unsigned_long *)&l);
  bVar1 = local_30;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&nextId);
  return bVar1;
}

Assistant:

breakpoint_id SetBreakpoint(const std::string& fileName,
                              size_t line) override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    auto nextId = nextBreakId++;
    breakpoints.emplace_back(nextId, fileName, line);
    return nextId;
  }